

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O1

bool pathIsAbsolute(QString *path)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QFileSystemEntry local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::startsWith(path,(QChar)0x3a,CaseSensitive);
  bVar2 = true;
  if (!bVar1) {
    QFileSystemEntry::QFileSystemEntry(&local_58,path);
    bVar2 = QFileSystemEntry::isAbsolute(&local_58);
    if (&(local_58.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
      _M_i = ((local_58.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
          ._M_i == 0) {
        QArrayData::deallocate(&(local_58.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_58.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_58.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_58.m_filePath.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool pathIsAbsolute(const QString &path)
{
    using FromInternalPath = QFileSystemEntry::FromInternalPath;
    return path.startsWith(':'_L1) || QFileSystemEntry(path, FromInternalPath{}).isAbsolute();
}